

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::outfaces(tetgenmesh *this,tetgenio *out)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  point pt;
  point pt_00;
  point pt_01;
  FILE *__stream;
  uint local_514;
  int local_504;
  int *piStack_500;
  int tidx;
  int *tet2facelist;
  int local_4f0;
  int i;
  int o2index;
  int highorderindex;
  point pp [3];
  point *extralist;
  triface workface;
  uint local_4a8;
  int index;
  int facenumber;
  int shift;
  int firstindex;
  int marker;
  int neigh2;
  int neigh1;
  int *emlist;
  int *elist;
  long faces;
  long ntets;
  point tapex;
  point tdest;
  point torg;
  face checkmark;
  triface tsymface;
  triface tface;
  char facefilename [1024];
  FILE *local_20;
  FILE *outfile;
  tetgenio *out_local;
  tetgenmesh *this_local;
  
  local_20 = (FILE *)0x0;
  triface::triface((triface *)&tsymface.ver);
  triface::triface((triface *)&checkmark.shver);
  face::face((face *)&torg);
  emlist = (int *)0x0;
  _neigh2 = (int *)0x0;
  marker = 0;
  firstindex = 0;
  shift = 0;
  workface._12_4_ = 0;
  triface::triface((triface *)&extralist);
  memset(&o2index,0,0x18);
  local_4f0 = 0;
  piStack_500 = (int *)0x0;
  if (out == (tetgenio *)0x0) {
    strcpy((char *)&tface.ver,this->b->outfilename);
    strcat((char *)&tface.ver,".face");
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",&tface.ver);
    }
    else {
      printf("Writing faces.\n");
    }
  }
  lVar11 = this->tetrahedrons->items - this->hullsize;
  uVar12 = (lVar11 * 4 + this->hullsize) / 2;
  if (out == (tetgenio *)0x0) {
    local_20 = fopen((char *)&tface.ver,"w");
    if (local_20 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",&tface.ver);
      terminatetetgen(this,1);
    }
    fprintf(local_20,"%ld  %d\n",uVar12,(ulong)((this->b->nobound != 0 ^ 0xffU) & 1));
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar12 * 3;
    uVar13 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    piVar14 = (int *)operator_new__(uVar13);
    out->trifacelist = piVar14;
    if (out->trifacelist == (int *)0x0) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this,1);
    }
    if (this->b->order == 2) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar12 * 3;
      uVar13 = SUB168(auVar3 * ZEXT816(4),0);
      if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
        uVar13 = 0xffffffffffffffff;
      }
      piVar14 = (int *)operator_new__(uVar13);
      out->o2facelist = piVar14;
    }
    if (this->b->nobound == 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar12;
      uVar13 = SUB168(auVar4 * ZEXT816(4),0);
      if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
        uVar13 = 0xffffffffffffffff;
      }
      piVar14 = (int *)operator_new__(uVar13);
      out->trifacemarkerlist = piVar14;
      if (out->trifacemarkerlist == (int *)0x0) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this,1);
      }
    }
    if (1 < this->b->neighout) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar12 << 1;
      uVar13 = SUB168(auVar5 * ZEXT816(4),0);
      if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
        uVar13 = 0xffffffffffffffff;
      }
      piVar14 = (int *)operator_new__(uVar13);
      out->face2tetlist = piVar14;
      if (out->face2tetlist == (int *)0x0) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this,1);
      }
    }
    out->numberoftrifaces = (int)uVar12;
    emlist = out->trifacelist;
    _neigh2 = out->trifacemarkerlist;
  }
  if (1 < this->b->neighout) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = lVar11 * 4;
    uVar12 = SUB168(auVar6 * ZEXT816(4),0);
    if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    piStack_500 = (int *)operator_new__(uVar12);
  }
  if (this->b->zeroindex == 0) {
    local_514 = this->in->firstnumber;
  }
  else {
    local_514 = 0;
  }
  index = 0;
  if ((this->in->firstnumber == 1) && (local_514 == 0)) {
    index = 1;
  }
  memorypool::traversalinit(this->tetrahedrons);
  tsymface._8_8_ = tetrahedrontraverse(this);
  local_4a8 = local_514;
  do {
    if (tsymface._8_8_ == 0) {
      if (out == (tetgenio *)0x0) {
        fprintf(local_20,"# Generated by %s\n",this->b->commandline);
        fclose(local_20);
      }
      if (1 < this->b->neighout) {
        if (out == (tetgenio *)0x0) {
          strcpy((char *)&tface.ver,this->b->outfilename);
          strcat((char *)&tface.ver,".t2f");
        }
        if (this->b->quiet == 0) {
          if (out == (tetgenio *)0x0) {
            printf("Writing %s.\n",&tface.ver);
          }
          else {
            printf("Writing tetrahedron-to-face map.\n");
          }
        }
        if (out == (tetgenio *)0x0) {
          __stream = fopen((char *)&tface.ver,"w");
          for (local_504 = 0; local_504 < lVar11; local_504 = local_504 + 1) {
            workface._12_4_ = local_504 * 4;
            fprintf(__stream,"%4d  %d %d %d %d\n",(ulong)(uint)(local_504 + this->in->firstnumber),
                    (ulong)(uint)piStack_500[(int)workface._12_4_],
                    (ulong)(uint)piStack_500[workface._12_4_ + 1],
                    (ulong)(uint)piStack_500[workface._12_4_ + 2],piStack_500[workface._12_4_ + 3]);
          }
          fclose(__stream);
          if (piStack_500 != (int *)0x0) {
            operator_delete__(piStack_500);
          }
        }
        else {
          out->tet2facelist = piStack_500;
        }
      }
      return;
    }
    for (tface.tet._0_4_ = 0; (int)tface.tet < 4; tface.tet._0_4_ = (int)tface.tet + 1) {
      fsym(this,(triface *)&tsymface.ver,(triface *)&checkmark.shver);
      bVar7 = ishulltet(this,(triface *)&checkmark.shver);
      if (bVar7) {
LAB_00177e51:
        pt = org(this,(triface *)&tsymface.ver);
        pt_00 = dest(this,(triface *)&tsymface.ver);
        pt_01 = apex(this,(triface *)&tsymface.ver);
        if (this->b->order == 2) {
          lVar1 = *(long *)(tsymface._8_8_ + 0x58);
          enext(this,(triface *)&tsymface.ver,(triface *)&extralist);
          for (tet2facelist._4_4_ = 0; tet2facelist._4_4_ < 3;
              tet2facelist._4_4_ = tet2facelist._4_4_ + 1) {
            *(undefined8 *)(&o2index + (long)tet2facelist._4_4_ * 2) =
                 *(undefined8 *)(lVar1 + (long)ver2edge[(int)workface.tet] * 8);
            enextself(this,(triface *)&extralist);
          }
        }
        if (this->b->nobound == 0) {
          if ((this->b->plc == 0) && (this->b->refine == 0)) {
            bVar7 = ishulltet(this,(triface *)&checkmark.shver);
            shift = (int)bVar7;
          }
          else {
            tspivot(this,(triface *)&tsymface.ver,(face *)&torg);
            if (torg == (point)0x0) {
              shift = 0;
            }
            else {
              shift = shellmark(this,(face *)&torg);
            }
          }
        }
        if (1 < this->b->neighout) {
          bVar7 = ishulltet(this,(triface *)&tsymface.ver);
          if (bVar7) {
            marker = -1;
          }
          else {
            marker = elemindex(this,(tetrahedron *)tsymface._8_8_);
          }
          bVar7 = ishulltet(this,(triface *)&checkmark.shver);
          if (bVar7) {
            firstindex = -1;
          }
          else {
            firstindex = elemindex(this,(tetrahedron *)checkmark._8_8_);
          }
          iVar8 = elemindex(this,(tetrahedron *)tsymface._8_8_);
          piStack_500[(int)((iVar8 - local_514) * 4 + (int)tface.tet)] = local_4a8;
          bVar7 = ishulltet(this,(triface *)&checkmark.shver);
          if (!bVar7) {
            iVar8 = elemindex(this,(tetrahedron *)checkmark._8_8_);
            piStack_500[(int)((iVar8 - local_514) * 4 + ((uint)tsymface.tet & 3))] = local_4a8;
          }
        }
        if (out == (tetgenio *)0x0) {
          iVar8 = pointmark(this,pt);
          iVar9 = pointmark(this,pt_00);
          iVar10 = pointmark(this,pt_01);
          fprintf(local_20,"%5d   %4d  %4d  %4d",(ulong)local_4a8,(ulong)(uint)(iVar8 - index),
                  (ulong)(uint)(iVar9 - index),(ulong)(uint)(iVar10 - index));
          if (this->b->order == 2) {
            iVar8 = pointmark(this,_o2index);
            iVar9 = pointmark(this,pp[0]);
            iVar10 = pointmark(this,pp[1]);
            fprintf(local_20,"  %4d  %4d  %4d",(ulong)(uint)(iVar8 - index),
                    (ulong)(uint)(iVar9 - index),(ulong)(uint)(iVar10 - index));
          }
          if (this->b->nobound == 0) {
            fprintf(local_20,"  %d",(ulong)(uint)shift);
          }
          if (1 < this->b->neighout) {
            fprintf(local_20,"    %5d  %5d",(ulong)(uint)marker,(ulong)(uint)firstindex);
          }
          fprintf(local_20,"\n");
        }
        else {
          iVar8 = pointmark(this,pt);
          emlist[(int)workface._12_4_] = iVar8 - index;
          workface._12_4_ = workface._12_4_ + 1;
          iVar8 = pointmark(this,pt_00);
          emlist[(int)workface._12_4_] = iVar8 - index;
          workface._12_4_ = workface._12_4_ + 1;
          iVar8 = pointmark(this,pt_01);
          iVar9 = workface._12_4_ + 1;
          emlist[(int)workface._12_4_] = iVar8 - index;
          workface._12_4_ = iVar9;
          if (this->b->order == 2) {
            iVar8 = pointmark(this,_o2index);
            out->o2facelist[local_4f0] = iVar8 - index;
            iVar8 = pointmark(this,pp[0]);
            iVar9 = local_4f0 + 2;
            out->o2facelist[local_4f0 + 1] = iVar8 - index;
            iVar8 = pointmark(this,pp[1]);
            local_4f0 = local_4f0 + 3;
            out->o2facelist[iVar9] = iVar8 - index;
          }
          if (this->b->nobound == 0) {
            _neigh2[(int)(local_4a8 - this->in->firstnumber)] = shift;
          }
          if (1 < this->b->neighout) {
            out->face2tetlist[(int)((local_4a8 - this->in->firstnumber) * 2)] = marker;
            out->face2tetlist[(int)((local_4a8 - this->in->firstnumber) * 2 + 1)] = firstindex;
          }
        }
        local_4a8 = local_4a8 + 1;
      }
      else {
        iVar8 = elemindex(this,(tetrahedron *)tsymface._8_8_);
        iVar9 = elemindex(this,(tetrahedron *)checkmark._8_8_);
        if (iVar8 < iVar9) goto LAB_00177e51;
      }
    }
    tsymface._8_8_ = tetrahedrontraverse(this);
  } while( true );
}

Assistant:

void tetgenmesh::outfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  triface tface, tsymface;
  face checkmark;
  point torg, tdest, tapex;
  long ntets, faces;
  int *elist = NULL, *emlist = NULL;
  int neigh1 = 0, neigh2 = 0;
  int marker = 0;
  int firstindex, shift;
  int facenumber;
  int index = 0;

  // For -o2 option.
  triface workface;
  point *extralist, pp[3] = {0,0,0}; 
  int highorderindex = 11; 
  int o2index = 0, i;

  // For -nn option.
  int *tet2facelist = NULL;
  int tidx; 

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  ntets = tetrahedrons->items - hullsize;
  faces = (ntets * 4l + hullsize) / 2l;

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 1);
    }
    fprintf(outfile, "%ld  %d\n", faces, !b->nobound);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[faces * 3];
    if (out->trifacelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    if (b->order == 2) {
      out->o2facelist = new int[faces * 3];
    }
    // Allocate memory for 'trifacemarkerlist' if necessary.
    if (!b->nobound) {
      out->trifacemarkerlist = new int[faces];
      if (out->trifacemarkerlist == (int *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    if (b->neighout > 1) {
      // '-nn' switch.
      out->face2tetlist = new int[faces * 2];
      if (out->face2tetlist == (int *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    out->numberoftrifaces = faces;
    elist = out->trifacelist;
    emlist = out->trifacemarkerlist;
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-face map.
    tet2facelist = new int[ntets * 4];
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tface.tet = tetrahedrontraverse();
  facenumber = firstindex; // in->firstnumber;
  // To loop over the set of faces, loop over all tetrahedra, and look at
  //   the four faces of each one. If its adjacent tet is a hull tet,
  //   operate on the face, otherwise, operate on the face only if the
  //   current tet has a smaller index than its neighbor.
  while (tface.tet != (tetrahedron *) NULL) {
    for (tface.ver = 0; tface.ver < 4; tface.ver ++) {
      fsym(tface, tsymface);
      if (ishulltet(tsymface) || 
          (elemindex(tface.tet) < elemindex(tsymface.tet))) {
        torg = org(tface);
        tdest = dest(tface);
        tapex = apex(tface);
        if (b->order == 2) { // -o2
          // Get the three extra vertices on edges.
          extralist = (point *) (tface.tet[highorderindex]);
          // The extra vertices are on edges opposite the corners.
          enext(tface, workface);
          for (i = 0; i < 3; i++) {
            pp[i] = extralist[ver2edge[workface.ver]];
            enextself(workface);
          }
        }
        if (!b->nobound) {
          // Get the boundary marker of this face.
          if (b->plc || b->refine) { 
            // Shell face is used.
            tspivot(tface, checkmark);
            if (checkmark.sh == NULL) {
              marker = 0;  // It is an inner face. It's marker is 0.
            } else {
              marker = shellmark(checkmark);
            }
          } else {
            // Shell face is not used, only distinguish outer and inner face.
            marker = (int) ishulltet(tsymface);
          }
        }
        if (b->neighout > 1) {
          // '-nn' switch. Output adjacent tets indices.
          if (!ishulltet(tface)) {
            neigh1 = elemindex(tface.tet);
          } else {
            neigh1 = -1;
          }
          if (!ishulltet(tsymface)) {
            neigh2 = elemindex(tsymface.tet);
          } else {
            neigh2 = -1;  
          }
		  // Fill the tetrahedron-to-face map.
		  tidx = elemindex(tface.tet) - firstindex;
		  tet2facelist[tidx * 4 + tface.ver] = facenumber;
		  if (!ishulltet(tsymface)) {
		    tidx = elemindex(tsymface.tet) - firstindex;
			tet2facelist[tidx * 4 + (tsymface.ver & 3)] = facenumber;
		  }
        }
        if (out == (tetgenio *) NULL) {
          // Face number, indices of three vertices.
          fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
                  pointmark(torg) - shift, pointmark(tdest) - shift,
                  pointmark(tapex) - shift);
          if (b->order == 2) { // -o2
            fprintf(outfile, "  %4d  %4d  %4d", pointmark(pp[0]) - shift, 
                    pointmark(pp[1]) - shift, pointmark(pp[2]) - shift);
          }
          if (!b->nobound) {
            // Output a boundary marker.
            fprintf(outfile, "  %d", marker);
          }
          if (b->neighout > 1) {
            fprintf(outfile, "    %5d  %5d", neigh1, neigh2);
          }
          fprintf(outfile, "\n");
        } else {
          // Output indices of three vertices.
          elist[index++] = pointmark(torg) - shift;
          elist[index++] = pointmark(tdest) - shift;
          elist[index++] = pointmark(tapex) - shift;
          if (b->order == 2) { // -o2
            out->o2facelist[o2index++] = pointmark(pp[0]) - shift;
            out->o2facelist[o2index++] = pointmark(pp[1]) - shift;
            out->o2facelist[o2index++] = pointmark(pp[2]) - shift;
          }
          if (!b->nobound) {
            emlist[facenumber - in->firstnumber] = marker;
          }
          if (b->neighout > 1) {
            out->face2tetlist[(facenumber - in->firstnumber) * 2]     = neigh1;
            out->face2tetlist[(facenumber - in->firstnumber) * 2 + 1] = neigh2;
          }
        }
        facenumber++;
      }
    }
    tface.tet = tetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-face map.
	if (out == (tetgenio *) NULL) {
	  strcpy(facefilename, b->outfilename);
      strcat(facefilename, ".t2f");
    }
	if (!b->quiet) {
      if (out == (tetgenio *) NULL) {
        printf("Writing %s.\n", facefilename);
      } else {
        printf("Writing tetrahedron-to-face map.\n");
      }
    }
	if (out == (tetgenio *) NULL) {
      outfile = fopen(facefilename, "w");
      for (tidx = 0; tidx < ntets; tidx++) {
        index = tidx * 4;
        fprintf(outfile, "%4d  %d %d %d %d\n", tidx + in->firstnumber,
                tet2facelist[index], tet2facelist[index+1], 
                tet2facelist[index+2], tet2facelist[index+3]);
      }
      fclose(outfile);
      delete [] tet2facelist;
    } else {
	  // Simply copy the address of the list to the output.
      out->tet2facelist = tet2facelist;
    }
  }
}